

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isPossibleUdpEntry(TokenKind kind)

{
  return (bool)((byte)(0x2008081a0064 >> ((byte)kind & 0x3f)) & kind < Hash);
}

Assistant:

bool SyntaxFacts::isPossibleUdpEntry(TokenKind kind) {
    switch (kind) {
        case TokenKind::IntegerLiteral:
        case TokenKind::IntegerBase:
        case TokenKind::Question:
        case TokenKind::Colon:
        case TokenKind::Semicolon:
        case TokenKind::Star:
        case TokenKind::Minus:
        case TokenKind::OpenParenthesis:
        case TokenKind::Identifier:
            return true;
        default:
            return false;
    }
}